

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniConfigurable_Test::~TApp_IniConfigurable_Test(TApp_IniConfigurable_Test *this)

{
  TApp_IniConfigurable_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, IniConfigurable) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);
    bool value;
    app.add_flag("--val", value)->configurable(true);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_NO_THROW(run());
    EXPECT_TRUE(value);
}